

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo.c
# Opt level: O0

char * eread(char *fmt,char *buf,size_t nbuf,int flag,...)

{
  char in_AL;
  char *pcVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [32];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  char *rep;
  va_list ap;
  int flag_local;
  size_t nbuf_local;
  char *buf_local;
  char *fmt_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = local_108;
  ap[0]._0_8_ = &stack0x00000008;
  rep._4_4_ = 0x30;
  rep._0_4_ = 0x20;
  local_e8 = in_R8;
  local_e0 = in_R9;
  pcVar1 = veread(fmt,buf,nbuf,flag,(__va_list_tag *)&rep);
  return pcVar1;
}

Assistant:

char *
eread(const char *fmt, char *buf, size_t nbuf, int flag, ...)
{
	va_list	 ap;
	char	*rep;

	va_start(ap, flag);
	rep = veread(fmt, buf, nbuf, flag, ap);
	va_end(ap);
	return (rep);
}